

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

int unqliteBuiltin_db_fetch_by_id(jx9_context *pCtx,int argc,jx9_value **argv)

{
  int iVar1;
  unqlite_col *pCol;
  jx9_value *pValue;
  int iFlag;
  char *pcVar2;
  int nByte;
  SyString sName;
  
  if (argc < 2) {
    pcVar2 = "Missing collection name and/or record ID";
  }
  else {
    pcVar2 = jx9_value_to_string(*argv,&nByte);
    if (nByte < 1) {
      pcVar2 = "Invalid collection name";
    }
    else {
      iVar1 = jx9_value_to_int(argv[1]);
      sName.nByte = nByte;
      sName.zString = pcVar2;
      pCol = unqliteCollectionFetch((unqlite_vm *)pCtx->pFunc->pUserData,&sName,iFlag);
      if (pCol == (unqlite_col *)0x0) goto LAB_001165be;
      pValue = jx9_context_new_scalar(pCtx);
      if (pValue != (jx9_value *)0x0) {
        iVar1 = unqliteCollectionFetchRecordById(pCol,(long)iVar1,pValue);
        if (iVar1 == 0) {
          jx9_result_value(pCtx,pValue);
          return 0;
        }
        goto LAB_001165be;
      }
      pcVar2 = "Jx9 is running out of memory";
    }
  }
  jx9_context_throw_error(pCtx,1,pcVar2);
LAB_001165be:
  jx9_result_null(pCtx);
  return 0;
}

Assistant:

static int unqliteBuiltin_db_fetch_by_id(jx9_context *pCtx,int argc,jx9_value **argv)
{
	unqlite_col *pCol;
	const char *zName;
	unqlite_vm *pVm;
	SyString sName;
	jx9_int64 nId;
	int nByte;
	int rc;
	/* Extract collection name */
	if( argc < 2 ){
		/* Missing arguments */
		jx9_context_throw_error(pCtx,JX9_CTX_ERR,"Missing collection name and/or record ID");
		/* Return NULL */
		jx9_result_null(pCtx);
		return JX9_OK;
	}
	zName = jx9_value_to_string(argv[0],&nByte);
	if( nByte < 1){
		jx9_context_throw_error(pCtx,JX9_CTX_ERR,"Invalid collection name");
		/* Return NULL */
		jx9_result_null(pCtx);
		return JX9_OK;
	}
	/* Extract the record ID */
	nId = jx9_value_to_int(argv[1]);
	SyStringInitFromBuf(&sName,zName,nByte);
	pVm = (unqlite_vm *)jx9_context_user_data(pCtx);
	/* Fetch the collection */
	pCol = unqliteCollectionFetch(pVm,&sName,UNQLITE_VM_AUTO_LOAD);
	if( pCol ){
		/* Fetch the desired record */
		jx9_value *pValue;
		pValue = jx9_context_new_scalar(pCtx);
		if( pValue == 0 ){
			jx9_context_throw_error(pCtx,JX9_CTX_ERR,"Jx9 is running out of memory");
			jx9_result_null(pCtx);
			return JX9_OK;
		}else{
			rc = unqliteCollectionFetchRecordById(pCol,nId,pValue);
			if( rc == UNQLITE_OK ){
				jx9_result_value(pCtx,pValue);
				/* pValue will be automatically released as soon we return from this function */
			}else{
				/* No such record, return null */
				jx9_result_null(pCtx);
			}
		}
	}else{
		/* No such collection, return null */
		jx9_result_null(pCtx);
	}
	return JX9_OK;
}